

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::EvalOperator
          (LoopPeelingInfo *this,CmpOperator cmp_op,SExpression lhs,SExpression rhs,bool *result)

{
  ScalarEvolutionAnalysis *pSVar1;
  Loop *pLVar2;
  SExpression rhs_00;
  SExpression rhs_01;
  SExpression rhs_02;
  SExpression rhs_03;
  bool bVar3;
  SENode *pSVar4;
  ScalarEvolutionAnalysis *pSVar5;
  SExpression local_b0;
  ScalarEvolutionAnalysis *local_a0;
  ScalarEvolutionAnalysis *local_98;
  SExpression local_90;
  LoopPeelingInfo *local_80;
  SENode *local_78;
  SExpression local_70;
  ScalarEvolutionAnalysis *local_60;
  ScalarEvolutionAnalysis *local_58;
  SExpression local_50;
  CmpOperator local_3c;
  LoopPeelingInfo *pLStack_38;
  CmpOperator cmp_op_local;
  LoopPeelingInfo *this_local;
  SExpression rhs_local;
  SExpression lhs_local;
  
  pSVar5 = lhs.scev_;
  rhs_local.scev_ = (ScalarEvolutionAnalysis *)lhs.node_;
  rhs_local.node_ = (SENode *)rhs.scev_;
  this_local = (LoopPeelingInfo *)rhs.node_;
  pSVar1 = this->scev_analysis_;
  pLVar2 = this->loop_;
  local_3c = cmp_op;
  pLStack_38 = this;
  pSVar4 = SExpression::operator_cast_to_SENode_((SExpression *)&rhs_local.scev_);
  bVar3 = ScalarEvolutionAnalysis::IsLoopInvariant(pSVar1,pLVar2,pSVar4);
  if (!bVar3) {
    __assert_fail("scev_analysis_->IsLoopInvariant(loop_, lhs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x3c3,
                  "bool spvtools::opt::LoopPeelingPass::LoopPeelingInfo::EvalOperator(CmpOperator, SExpression, SExpression, bool *) const"
                 );
  }
  pSVar1 = this->scev_analysis_;
  pLVar2 = this->loop_;
  pSVar4 = SExpression::operator_cast_to_SENode_((SExpression *)&this_local);
  bVar3 = ScalarEvolutionAnalysis::IsLoopInvariant(pSVar1,pLVar2,pSVar4);
  if (bVar3) {
    switch(local_3c) {
    case kLT:
      pSVar1 = this->scev_analysis_;
      local_60 = rhs_local.scev_;
      rhs_03.scev_ = pSVar5;
      rhs_03.node_ = (SENode *)rhs_local.scev_;
      local_58 = pSVar5;
      local_50 = SExpression::operator-((SExpression *)&this_local,rhs_03);
      pSVar4 = SExpression::operator_cast_to_SENode_(&local_50);
      lhs_local.scev_._7_1_ = ScalarEvolutionAnalysis::IsAlwaysGreaterThanZero(pSVar1,pSVar4,result)
      ;
      break;
    case kGT:
      pSVar1 = this->scev_analysis_;
      local_80 = this_local;
      local_78 = rhs_local.node_;
      rhs_02.scev_ = (ScalarEvolutionAnalysis *)rhs_local.node_;
      rhs_02.node_ = (SENode *)this_local;
      local_70 = SExpression::operator-((SExpression *)&rhs_local.scev_,rhs_02);
      pSVar4 = SExpression::operator_cast_to_SENode_(&local_70);
      lhs_local.scev_._7_1_ = ScalarEvolutionAnalysis::IsAlwaysGreaterThanZero(pSVar1,pSVar4,result)
      ;
      break;
    case kLE:
      pSVar1 = this->scev_analysis_;
      local_a0 = rhs_local.scev_;
      rhs_01.scev_ = pSVar5;
      rhs_01.node_ = (SENode *)rhs_local.scev_;
      local_98 = pSVar5;
      local_90 = SExpression::operator-((SExpression *)&this_local,rhs_01);
      pSVar4 = SExpression::operator_cast_to_SENode_(&local_90);
      lhs_local.scev_._7_1_ =
           ScalarEvolutionAnalysis::IsAlwaysGreaterOrEqualToZero(pSVar1,pSVar4,result);
      break;
    case kGE:
      pSVar1 = this->scev_analysis_;
      rhs_00.scev_ = (ScalarEvolutionAnalysis *)rhs_local.node_;
      rhs_00.node_ = (SENode *)this_local;
      local_b0 = SExpression::operator-((SExpression *)&rhs_local.scev_,rhs_00);
      pSVar4 = SExpression::operator_cast_to_SENode_(&local_b0);
      lhs_local.scev_._7_1_ =
           ScalarEvolutionAnalysis::IsAlwaysGreaterOrEqualToZero(pSVar1,pSVar4,result);
      break;
    default:
      lhs_local.scev_._7_1_ = false;
    }
    return lhs_local.scev_._7_1_;
  }
  __assert_fail("scev_analysis_->IsLoopInvariant(loop_, rhs)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                ,0x3c4,
                "bool spvtools::opt::LoopPeelingPass::LoopPeelingInfo::EvalOperator(CmpOperator, SExpression, SExpression, bool *) const"
               );
}

Assistant:

bool LoopPeelingPass::LoopPeelingInfo::EvalOperator(CmpOperator cmp_op,
                                                    SExpression lhs,
                                                    SExpression rhs,
                                                    bool* result) const {
  assert(scev_analysis_->IsLoopInvariant(loop_, lhs));
  assert(scev_analysis_->IsLoopInvariant(loop_, rhs));
  // We perform the test: 0 cmp_op rhs - lhs
  // What is left is then to determine the sign of the expression.
  switch (cmp_op) {
    case CmpOperator::kLT: {
      return scev_analysis_->IsAlwaysGreaterThanZero(rhs - lhs, result);
    }
    case CmpOperator::kGT: {
      return scev_analysis_->IsAlwaysGreaterThanZero(lhs - rhs, result);
    }
    case CmpOperator::kLE: {
      return scev_analysis_->IsAlwaysGreaterOrEqualToZero(rhs - lhs, result);
    }
    case CmpOperator::kGE: {
      return scev_analysis_->IsAlwaysGreaterOrEqualToZero(lhs - rhs, result);
    }
  }
  return false;
}